

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O1

void __thiscall QThreadPool::startOnReservedThread(QThreadPool *this,QRunnable *runnable)

{
  __base_type copy;
  QThreadPoolPrivate *this_00;
  QMutex *this_01;
  bool bVar1;
  
  if (runnable == (QRunnable *)0x0) {
    releaseThread(this);
    return;
  }
  this_00 = (QThreadPoolPrivate *)(this->super_QObject).d_ptr.d;
  this_01 = &this_00->mutex;
  if ((this_00->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar1 = (this_01->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar1) {
      (this_01->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar1) goto LAB_003d4a6e;
  }
  QBasicMutex::lockInternal(&this_01->super_QBasicMutex);
LAB_003d4a6e:
  this_00->reservedThreads = this_00->reservedThreads + -1;
  bVar1 = QThreadPoolPrivate::tryStart(this_00,runnable);
  if (!bVar1) {
    QThreadPoolPrivate::enqueueTask(this_00,runnable,0x7fffffff);
  }
  LOCK();
  copy._M_p = (this_01->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (this_01->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy._M_p != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(&this_01->super_QBasicMutex,copy._M_p);
    return;
  }
  return;
}

Assistant:

void QThreadPool::startOnReservedThread(QRunnable *runnable)
{
    if (!runnable)
        return releaseThread();

    Q_D(QThreadPool);
    QMutexLocker locker(&d->mutex);
    Q_ASSERT(d->reservedThreads > 0);
    --d->reservedThreads;

    if (!d->tryStart(runnable)) {
        // This can only happen if we reserved max threads,
        // and something took the one minimum thread.
        d->enqueueTask(runnable, INT_MAX);
    }
}